

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::RpcResponseImpl::~RpcResponseImpl
          (RpcResponseImpl *this)

{
  RpcResponseImpl *this_local;
  
  kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>::~Own
            (&this->questionRef);
  ReaderCapabilityTable::~ReaderCapabilityTable(&this->capTable);
  kj::Own<capnp::IncomingRpcMessage>::~Own(&this->message);
  kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>::~Own(&this->connectionState);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  RpcResponse::~RpcResponse(&this->super_RpcResponse);
  return;
}

Assistant:

RpcResponseImpl(RpcConnectionState& connectionState,
                    kj::Own<QuestionRef>&& questionRef,
                    kj::Own<IncomingRpcMessage>&& message,
                    kj::Array<kj::Maybe<kj::Own<ClientHook>>> capTableArray,
                    AnyPointer::Reader results)
        : connectionState(kj::addRef(connectionState)),
          message(kj::mv(message)),
          capTable(kj::mv(capTableArray)),
          reader(capTable.imbue(results)),
          questionRef(kj::mv(questionRef)) {}